

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valueless_test.cpp
# Opt level: O2

void testValueless_CallbackCalled_ShouldSucceed(void)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool triggered;
  allocator_type local_e5;
  allocator<char> local_e4;
  allocator<char> local_e3;
  allocator_type local_e2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e1;
  Argengine ae;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"test",(allocator<char> *)&triggered);
  std::__cxx11::string::string<std::allocator<char>>(local_98,"-f",&local_e4);
  __l._M_len = 2;
  __l._M_array = &local_b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,__l,&local_e5);
  juzzlin::Argengine::Argengine(&ae,&local_78,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_b8._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  triggered = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"-f",&local_e4);
  std::__cxx11::string::string<std::allocator<char>>(local_98,"--foo",(allocator<char> *)&local_e5);
  __l_00._M_len = 2;
  __l_00._M_array = &local_b8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_40,__l_00,&local_e1,&local_e2);
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/valueless_test/valueless_test.cpp:57:37)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/valueless_test/valueless_test.cpp:57:37)>
             ::_M_manager;
  local_d8._M_unused._0_8_ = (undefined8)(allocator<char> *)&triggered;
  std::__cxx11::string::string<std::allocator<char>>(local_60,"",&local_e3);
  juzzlin::Argengine::addOption(&ae,&local_40,&local_d8,0,local_60);
  std::__cxx11::string::~string(local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_40);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_b8._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  juzzlin::Argengine::parse();
  if (triggered != false) {
    juzzlin::Argengine::~Argengine(&ae);
    return;
  }
  __assert_fail("triggered",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/valueless_test/valueless_test.cpp"
                ,0x3e,"void testValueless_CallbackCalled_ShouldSucceed()");
}

Assistant:

void testValueless_CallbackCalled_ShouldSucceed()
{
    Argengine ae({ "test", "-f" });
    bool triggered {};
    ae.addOption({ "-f", "--foo" }, [&] {
        triggered = true;
    });
    ae.parse();

    assert(triggered);
}